

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O2

void MultipleAllocations(bool *result)

{
  TestClass1 *pTVar1;
  TestClass2 *pTVar2;
  undefined8 uVar3;
  int i;
  long lVar4;
  int i_1;
  undefined8 uStack_e0;
  uint64_t memLeakSize;
  size_t memLeakCount;
  TestClass2 *testArray2 [10];
  TestClass1 *testArray1 [10];
  
  __start(false,"",false);
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    pTVar1 = (TestClass1 *)operator_new(4);
    pTVar1->x = 0;
    testArray1[lVar4] = pTVar1;
    pTVar2 = (TestClass2 *)operator_new(0x30);
    TestClass2::TestClass2(pTVar2);
    testArray2[lVar4] = pTVar2;
  }
  __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
  if (memLeakCount == 0x1e) {
    if (memLeakSize == 600) {
      for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
        pTVar2 = testArray2[lVar4];
        if (pTVar2 != (TestClass2 *)0x0) {
          TestClass2::~TestClass2(pTVar2);
        }
        operator_delete(pTVar2,0x30);
      }
      __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
      if (memLeakCount == 10) {
        if (memLeakSize == 0x28) {
          for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
            operator_delete(testArray1[lVar4],4);
          }
          __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
          if ((memLeakCount == 0) && (memLeakCount = memLeakSize, memLeakSize == 0)) {
            __stop_and_free_all_mem();
            return;
          }
          uStack_e0 = 0x5f;
          uVar3 = uStack_e0;
          uStack_e0 = 0;
        }
        else {
          uStack_e0 = 0x59;
          uVar3 = uStack_e0;
          uStack_e0 = 0x28;
          memLeakCount = memLeakSize;
        }
      }
      else {
        uVar3 = 0x59;
        uStack_e0 = 10;
      }
    }
    else {
      uVar3 = 0x53;
      uStack_e0 = 600;
      memLeakCount = memLeakSize;
    }
  }
  else {
    uVar3 = 0x53;
    uStack_e0 = 0x1e;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultipleAllocations",
         uVar3,memLeakCount,uStack_e0);
  *result = false;
  return;
}

Assistant:

TEST_CASE(MultipleAllocations) {

    START_TEST;

    TestClass1* testArray1[10];
    TestClass2* testArray2[10];

    for (int i = 0; i < 10; i++) {
        testArray1[i] = new TestClass1();
        testArray2[i] = new TestClass2();
    }

    CHECK_MEM_LEAK(30, 10*(sizeof(TestClass1) + sizeof(TestClass2) + sizeof(double)));

    for (int i = 0; i < 10; i++) {
        delete testArray2[i];
    }

    CHECK_MEM_LEAK(10, 10*sizeof(TestClass1));

    for (int i = 0; i < 10; i++) {
        delete testArray1[i];
    }

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}